

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  size_t in_RCX;
  ReadableDirectory *pRVar1;
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<kj::ReadableDirectory>_> MVar2;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar3;
  PathPtr path_00;
  Maybe<kj::AutoCloseFd> local_2c;
  AutoCloseFd local_20;
  AutoCloseFd local_18;
  
  path_00.parts.ptr = (String *)path.parts.size_;
  path_00.parts.size_ = in_RCX;
  tryOpenSubdirInternal(&local_2c,(DiskHandle *)path.parts.ptr,path_00);
  MVar2 = Maybe<kj::AutoCloseFd>::map<kj::Own<kj::ReadableDirectory>_(&)(kj::AutoCloseFd)>
                    ((Maybe<kj::AutoCloseFd> *)&local_20,
                     (_func_Own<kj::ReadableDirectory>_AutoCloseFd *)&local_2c);
  pRVar1 = MVar2.ptr.ptr;
  this->fd = local_20;
  this[1].fd = local_18;
  local_18.fd = 0;
  local_18.unwindDetector.uncaughtCount = 0;
  if (local_2c.ptr.isSet == true) {
    AutoCloseFd::~AutoCloseFd(&local_2c.ptr.field_1.value);
    pRVar1 = extraout_RDX;
  }
  MVar3.ptr.ptr = pRVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }